

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O1

TrieNode<unsigned_short,_vector_brodnik<unsigned_char_*>_> * __thiscall
BurstSimple<unsigned_short>::operator()
          (BurstSimple<unsigned_short> *this,vector_brodnik<unsigned_char_*> *bucket,size_t depth)

{
  uchar **ppuVar1;
  ushort uVar2;
  TrieNode<unsigned_short,_vector_brodnik<unsigned_char_*>_> *this_00;
  uchar *puVar3;
  vector_brodnik<unsigned_char_*> *pvVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  uint j;
  long lVar8;
  size_t index;
  array<unsigned_short,_64UL> cache;
  array<unsigned_char_*,_64UL> strings;
  ushort auStack_2b0 [64];
  undefined8 auStack_230 [64];
  
  this_00 = (TrieNode<unsigned_short,_vector_brodnik<unsigned_char_*>_> *)operator_new(0x18);
  (this_00->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar5 = ((2L << (bucket->_superblock & 0x3f)) -
          ((ulong)bucket->_left_in_superblock * bucket->_block_size + bucket->_left_in_block)) +
          0xffffffc0;
  uVar6 = 0;
  uVar7 = (uint)uVar5;
  if (0x3f < uVar7) {
    uVar6 = 0;
    do {
      lVar8 = 0;
      do {
        puVar3 = vector_brodnik<unsigned_char_*>::operator[](bucket,lVar8 + uVar6);
        auStack_230[lVar8] = puVar3;
        if (puVar3 == (uchar *)0x0) goto LAB_001a36be;
        if (puVar3[depth] == '\0') {
          uVar2 = 0;
        }
        else {
          uVar2 = CONCAT11(puVar3[depth],puVar3[depth + 1]);
        }
        auStack_2b0[lVar8] = uVar2;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x40);
      lVar8 = 0;
      do {
        pvVar4 = TrieNode<unsigned_short,_vector_brodnik<unsigned_char_*>_>::get_bucket
                           (this_00,(uint)auStack_2b0[lVar8]);
        if (pvVar4 == (vector_brodnik<unsigned_char_*> *)0x0) {
          __assert_fail("sub_bucket",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                        ,0x78,
                        "TrieNode<CharT, BucketT> *BurstSimple<unsigned short>::operator()(const BucketT &, size_t) const [CharT = unsigned short, BucketT = vector_brodnik<unsigned char *>]"
                       );
        }
        if (pvVar4->_left_in_block == 0) {
          vector_brodnik<unsigned_char_*>::grow(pvVar4);
        }
        puVar3 = (uchar *)auStack_230[lVar8];
        ppuVar1 = pvVar4->_insertpos;
        pvVar4->_insertpos = ppuVar1 + 1;
        *ppuVar1 = puVar3;
        pvVar4->_left_in_block = pvVar4->_left_in_block - 1;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x40);
      uVar6 = uVar6 + 0x40;
    } while (uVar6 < (uVar7 & 0xffffffc0));
  }
  if ((uint)uVar6 < uVar7) {
    index = uVar6 & 0xffffffff;
    do {
      puVar3 = vector_brodnik<unsigned_char_*>::operator[](bucket,index);
      if (puVar3 == (uchar *)0x0) {
LAB_001a36be:
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x2e,"uint16_t get_char(unsigned char *, size_t)");
      }
      if (puVar3[depth] == '\0') {
        uVar7 = 0;
      }
      else {
        uVar7 = (uint)CONCAT11(puVar3[depth],puVar3[depth + 1]);
      }
      pvVar4 = TrieNode<unsigned_short,_vector_brodnik<unsigned_char_*>_>::get_bucket(this_00,uVar7)
      ;
      if (pvVar4 == (vector_brodnik<unsigned_char_*> *)0x0) {
        __assert_fail("sub_bucket",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                      ,0x80,
                      "TrieNode<CharT, BucketT> *BurstSimple<unsigned short>::operator()(const BucketT &, size_t) const [CharT = unsigned short, BucketT = vector_brodnik<unsigned char *>]"
                     );
      }
      if (pvVar4->_left_in_block == 0) {
        vector_brodnik<unsigned_char_*>::grow(pvVar4);
      }
      ppuVar1 = pvVar4->_insertpos;
      pvVar4->_insertpos = ppuVar1 + 1;
      *ppuVar1 = puVar3;
      pvVar4->_left_in_block = pvVar4->_left_in_block - 1;
      index = index + 1;
    } while (index < (uVar5 & 0xffffffff));
  }
  return this_00;
}

Assistant:

TrieNode<CharT, BucketT>*
	operator()(const BucketT& bucket, size_t depth) const
	{
		TrieNode<CharT, BucketT>* new_node = new TrieNode<CharT, BucketT>;
		const unsigned bucket_size = bucket.size();
		// Use a small cache to reduce memory stalls. Also cache the
		// string pointers, in case the indexing operation of the
		// container is expensive.
		unsigned i=0;
		for (; i < bucket_size-bucket_size%64; i+=64) {
			std::array<CharT, 64> cache;
			std::array<unsigned char*, 64> strings;
			for (unsigned j=0; j < 64; ++j) {
				strings[j] = bucket[i+j];
				cache[j] = get_char<CharT>(strings[j], depth);
			}
			for (unsigned j=0; j < 64; ++j) {
				const CharT ch = cache[j];
				BucketT* sub_bucket = new_node->get_bucket(ch);
				assert(sub_bucket);
				sub_bucket->push_back(strings[j]);
			}
		}
		for (; i < bucket_size; ++i) {
			unsigned char* ptr = bucket[i];
			const CharT ch = get_char<CharT>(ptr, depth);
			BucketT* sub_bucket = new_node->get_bucket(ch);
			assert(sub_bucket);
			sub_bucket->push_back(ptr);
		}
		return new_node;
	}